

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_initgamedialog.h
# Opt level: O3

void __thiscall Ui_InitGameDialog::retranslateUi(Ui_InitGameDialog *this,QDialog *InitGameDialog)

{
  QLabel *pQVar1;
  QArrayData *local_30 [3];
  
  QCoreApplication::translate((char *)local_30,"InitGameDialog","Dialog",0);
  QWidget::setWindowTitle((QString *)InitGameDialog);
  if (local_30[0] != (QArrayData *)0x0) {
    LOCK();
    (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_30[0],2,8);
    }
  }
  pQVar1 = this->player1Label;
  QCoreApplication::translate((char *)local_30,"InitGameDialog","Player1:",0);
  QLabel::setText((QString *)pQVar1);
  if (local_30[0] != (QArrayData *)0x0) {
    LOCK();
    (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_30[0],2,8);
    }
  }
  pQVar1 = this->player2Label;
  QCoreApplication::translate((char *)local_30,"InitGameDialog","Player2:",0);
  QLabel::setText((QString *)pQVar1);
  if (local_30[0] != (QArrayData *)0x0) {
    LOCK();
    (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_30[0],2,8);
    }
  }
  pQVar1 = this->label;
  QCoreApplication::translate((char *)local_30,"InitGameDialog","Grid size:",0);
  QLabel::setText((QString *)pQVar1);
  if (local_30[0] != (QArrayData *)0x0) {
    LOCK();
    (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_30[0],2,8);
    }
  }
  return;
}

Assistant:

void retranslateUi(QDialog *InitGameDialog)
    {
        InitGameDialog->setWindowTitle(QCoreApplication::translate("InitGameDialog", "Dialog", nullptr));
        player1Label->setText(QCoreApplication::translate("InitGameDialog", "Player1:", nullptr));
        player2Label->setText(QCoreApplication::translate("InitGameDialog", "Player2:", nullptr));
        label->setText(QCoreApplication::translate("InitGameDialog", "Grid size:", nullptr));
    }